

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall SchnorrPubkey_Constructor_Test::TestBody(SchnorrPubkey_Constructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_290;
  AssertHelper local_270;
  Message local_268;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1e0;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar__1;
  Message local_1b0;
  string local_1a8;
  string local_188;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  Message local_150;
  string local_148;
  string local_128;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  ByteData256 local_e0;
  undefined1 local_c8 [8];
  SchnorrPubkey b256_obj;
  SchnorrPubkey sk_obj;
  AssertHelper local_78;
  Message local_70;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  undefined1 local_40 [8];
  SchnorrPubkey empty_obj;
  SchnorrPubkey sk_pubkey;
  SchnorrPubkey_Constructor_Test *this_local;
  
  cfd::core::SchnorrPubkey::FromPrivkey
            ((SchnorrPubkey *)
             &empty_obj.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&::sk,(bool *)0x0);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_40);
  bVar1 = cfd::core::SchnorrPubkey::IsValid((SchnorrPubkey *)local_40);
  local_61 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &sk_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_60,
               (AssertionResult *)"empty_obj.IsValid()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xa7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string
              ((string *)
               &sk_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  cfd::core::SchnorrPubkey::FromPrivkey
            ((SchnorrPubkey *)
             &b256_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&::sk,(bool *)0x0);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)&gtest_ar.message_,
             (SchnorrPubkey *)
             &empty_obj.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::ByteData256(&local_e0,(ByteData *)&gtest_ar.message_);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_c8,&local_e0);
  cfd::core::ByteData256::~ByteData256(&local_e0);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_128,
             (SchnorrPubkey *)
             &empty_obj.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_148,
             (SchnorrPubkey *)
             &b256_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_108,"sk_pubkey.GetHex()","sk_obj.GetHex()",&local_128,
             &local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_188,
             (SchnorrPubkey *)
             &empty_obj.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1a8,(SchnorrPubkey *)local_c8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_168,"sk_pubkey.GetHex()","b256_obj.GetHex()",&local_188,
             &local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1c9 = cfd::core::SchnorrPubkey::IsValid
                        ((SchnorrPubkey *)
                         &b256_obj.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_1c8,
               (AssertionResult *)"sk_obj.IsValid()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_211 = cfd::core::SchnorrPubkey::IsValid((SchnorrPubkey *)local_c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_210,&local_211,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_210,
               (AssertionResult *)"b256_obj.IsValid()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_259 = cfd::core::SchnorrPubkey::Equals
                        ((SchnorrPubkey *)
                         &b256_obj.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)local_c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_258,&local_259,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_290,(internal *)local_258,(AssertionResult *)"sk_obj.Equals(b256_obj)","false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_c8);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &b256_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_40);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &empty_obj.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(SchnorrPubkey, Constructor) {
  auto sk_pubkey = SchnorrPubkey::FromPrivkey(sk);
  SchnorrPubkey empty_obj;

  EXPECT_FALSE(empty_obj.IsValid());

  auto sk_obj = SchnorrPubkey::FromPrivkey(sk);
  SchnorrPubkey b256_obj(ByteData256(sk_pubkey.GetData()));

  EXPECT_EQ(sk_pubkey.GetHex(), sk_obj.GetHex());
  EXPECT_EQ(sk_pubkey.GetHex(), b256_obj.GetHex());
  EXPECT_TRUE(sk_obj.IsValid());
  EXPECT_TRUE(b256_obj.IsValid());
  EXPECT_TRUE(sk_obj.Equals(b256_obj));
}